

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O1

bool Catch::shouldShowDuration(IConfig *config,double duration)

{
  int iVar1;
  byte bVar2;
  double extraout_XMM0_Qa;
  
  iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0xb])();
  bVar2 = 1;
  if (iVar1 != 1) {
    iVar1 = (*(config->super_NonCopyable)._vptr_NonCopyable[0xb])(config);
    if (iVar1 == 2) {
      bVar2 = 0;
    }
    else {
      (*(config->super_NonCopyable)._vptr_NonCopyable[0xc])(config);
      bVar2 = -(extraout_XMM0_Qa <= duration && 0.0 <= extraout_XMM0_Qa);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool shouldShowDuration( IConfig const& config, double duration ) {
        if ( config.showDurations() == ShowDurations::Always ) {
            return true;
        }
        if ( config.showDurations() == ShowDurations::Never ) {
            return false;
        }
        const double min = config.minDuration();
        return min >= 0 && duration >= min;
    }